

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void * big_alloc(size_t size)

{
  size_t *__addr;
  void *__addr_00;
  size_t __len;
  ulong __len_00;
  size_t __len_01;
  size_t *psVar1;
  
  __len = (ulong)((size + 0x10 & 0xfff) != 0) * 0x1000 + (size + 0x10 & 0xfffffffffffff000);
  psVar1 = (size_t *)0x0;
  __addr = (size_t *)mmap(sys_alloc_next_alloc,__len,3,0x22,-1,0);
  if (__addr != (size_t *)0xffffffffffffffff) {
    psVar1 = __addr;
    if (((ulong)__addr & 0x7fff) != 0) {
      munmap(__addr,__len);
      psVar1 = (size_t *)0x0;
      __addr_00 = mmap((void *)0x0,__len + 0x8000,3,0x22,-1,0);
      if (__addr_00 == (void *)0xffffffffffffffff) goto LAB_001314b8;
      __len_00 = (ulong)((uint)__addr_00 & 0x7fff);
      __len_01 = 0x8000 - __len_00;
      munmap(__addr_00,__len_01);
      psVar1 = (size_t *)(__len_01 + (long)__addr_00);
      munmap((void *)((long)psVar1 + __len),__len_00);
    }
    sys_alloc_next_alloc = psVar1 + 0x8000000;
  }
LAB_001314b8:
  if (psVar1 == (size_t *)0x0) {
    psVar1 = (size_t *)0x0;
  }
  else {
    *psVar1 = __len;
    psVar1 = psVar1 + 2;
  }
  return psVar1;
}

Assistant:

static inline void *big_alloc(size_t size) {
  size = sys_round_size(size + 16);
  size_t *mem = sys_alloc(size, 1);
  if (!mem)
    goto error;
  *mem = size;
  return (void *)(((uintptr_t)mem) + 16);
error:
  return NULL;
}